

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CCEXP.hpp
# Opt level: O1

void CCEXP::LoadTable<float>(CCEXP *obj,char *name,char *type)

{
  FILE *__stream;
  ulong new_elements_;
  bool bVar1;
  int iVar2;
  size_t sVar3;
  uint64_t uVar4;
  ulong uVar5;
  long lVar6;
  uint uVar7;
  char *pcVar8;
  CCEXPMat<float> *this;
  long __off;
  uint64_t uVar9;
  uint64_t N;
  uint64_t MaxRows;
  uint64_t typeSize;
  MVECTOR<unsigned_long> DPL;
  shared_ptr<CCEXP::CCEXPBase> local_108;
  MVECTOR<float> rowData;
  char loadType [64];
  char loadName [64];
  
  obj->ErrorId = 0;
  if (obj->isActive != true) {
    return;
  }
  uVar7 = obj->Status;
  obj->Status = 2;
  if (uVar7 < 2) {
    __stream = (FILE *)obj->lfp;
    if (__stream != (FILE *)0x0) {
      loadName[0x30] = '\0';
      loadName[0x31] = '\0';
      loadName[0x32] = '\0';
      loadName[0x33] = '\0';
      loadName[0x34] = '\0';
      loadName[0x35] = '\0';
      loadName[0x36] = '\0';
      loadName[0x37] = '\0';
      loadName[0x38] = '\0';
      loadName[0x39] = '\0';
      loadName[0x3a] = '\0';
      loadName[0x3b] = '\0';
      loadName[0x3c] = '\0';
      loadName[0x3d] = '\0';
      loadName[0x3e] = '\0';
      loadName[0x3f] = '\0';
      loadName[0x20] = '\0';
      loadName[0x21] = '\0';
      loadName[0x22] = '\0';
      loadName[0x23] = '\0';
      loadName[0x24] = '\0';
      loadName[0x25] = '\0';
      loadName[0x26] = '\0';
      loadName[0x27] = '\0';
      loadName[0x28] = '\0';
      loadName[0x29] = '\0';
      loadName[0x2a] = '\0';
      loadName[0x2b] = '\0';
      loadName[0x2c] = '\0';
      loadName[0x2d] = '\0';
      loadName[0x2e] = '\0';
      loadName[0x2f] = '\0';
      loadName[0x10] = '\0';
      loadName[0x11] = '\0';
      loadName[0x12] = '\0';
      loadName[0x13] = '\0';
      loadName[0x14] = '\0';
      loadName[0x15] = '\0';
      loadName[0x16] = '\0';
      loadName[0x17] = '\0';
      loadName[0x18] = '\0';
      loadName[0x19] = '\0';
      loadName[0x1a] = '\0';
      loadName[0x1b] = '\0';
      loadName[0x1c] = '\0';
      loadName[0x1d] = '\0';
      loadName[0x1e] = '\0';
      loadName[0x1f] = '\0';
      loadName[0] = '\0';
      loadName[1] = '\0';
      loadName[2] = '\0';
      loadName[3] = '\0';
      loadName[4] = '\0';
      loadName[5] = '\0';
      loadName[6] = '\0';
      loadName[7] = '\0';
      loadName[8] = '\0';
      loadName[9] = '\0';
      loadName[10] = '\0';
      loadName[0xb] = '\0';
      loadName[0xc] = '\0';
      loadName[0xd] = '\0';
      loadName[0xe] = '\0';
      loadName[0xf] = '\0';
      loadType[0x30] = '\0';
      loadType[0x31] = '\0';
      loadType[0x32] = '\0';
      loadType[0x33] = '\0';
      loadType[0x34] = '\0';
      loadType[0x35] = '\0';
      loadType[0x36] = '\0';
      loadType[0x37] = '\0';
      loadType[0x38] = '\0';
      loadType[0x39] = '\0';
      loadType[0x3a] = '\0';
      loadType[0x3b] = '\0';
      loadType[0x3c] = '\0';
      loadType[0x3d] = '\0';
      loadType[0x3e] = '\0';
      loadType[0x3f] = '\0';
      loadType[0x20] = '\0';
      loadType[0x21] = '\0';
      loadType[0x22] = '\0';
      loadType[0x23] = '\0';
      loadType[0x24] = '\0';
      loadType[0x25] = '\0';
      loadType[0x26] = '\0';
      loadType[0x27] = '\0';
      loadType[0x28] = '\0';
      loadType[0x29] = '\0';
      loadType[0x2a] = '\0';
      loadType[0x2b] = '\0';
      loadType[0x2c] = '\0';
      loadType[0x2d] = '\0';
      loadType[0x2e] = '\0';
      loadType[0x2f] = '\0';
      loadType[0x10] = '\0';
      loadType[0x11] = '\0';
      loadType[0x12] = '\0';
      loadType[0x13] = '\0';
      loadType[0x14] = '\0';
      loadType[0x15] = '\0';
      loadType[0x16] = '\0';
      loadType[0x17] = '\0';
      loadType[0x18] = '\0';
      loadType[0x19] = '\0';
      loadType[0x1a] = '\0';
      loadType[0x1b] = '\0';
      loadType[0x1c] = '\0';
      loadType[0x1d] = '\0';
      loadType[0x1e] = '\0';
      loadType[0x1f] = '\0';
      loadType[0] = '\0';
      loadType[1] = '\0';
      loadType[2] = '\0';
      loadType[3] = '\0';
      loadType[4] = '\0';
      loadType[5] = '\0';
      loadType[6] = '\0';
      loadType[7] = '\0';
      loadType[8] = '\0';
      loadType[9] = '\0';
      loadType[10] = '\0';
      loadType[0xb] = '\0';
      loadType[0xc] = '\0';
      loadType[0xd] = '\0';
      loadType[0xe] = '\0';
      loadType[0xf] = '\0';
      bVar1 = false;
      typeSize = 0;
      N = 0;
      MaxRows = 0;
      uVar5 = obj->LoadTableIndex;
      __off = 0;
      if (uVar5 < obj->LoadTotalTables) {
        do {
          __off = ftell(__stream);
          fread(loadName,1,0x40,__stream);
          fread(loadType,1,0x40,__stream);
          fread(&typeSize,8,1,__stream);
          fread(&N,8,1,__stream);
          fread(&MaxRows,8,1,__stream);
          uVar9 = MaxRows;
          if (N < MaxRows) {
            uVar9 = N;
          }
          N = uVar9;
          iVar2 = strcmp(loadName,name);
          if (iVar2 == 0) {
            obj->LoadTableIndex = uVar5 + 1;
            bVar1 = true;
            goto LAB_0011c427;
          }
          ns_MVECTOR::MVECTOR_Base::MVECTOR_Base(&DPL.super_MVECTOR_Base);
          DPL.elements._4_4_ = 0;
          DPL.mem_elements = 0;
          DPL.dbg = 0;
          DPL.pdata._0_4_ = 0;
          DPL.pdata._4_4_ = 0;
          DPL.elements._0_4_ = 0;
          DPL.step_elements = 0x400;
          DPL.step_elements_back = 0x2800;
          DPL.sptr.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)0x0;
          DPL.sptr.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          ns_MVECTOR::MVECTOR<unsigned_long>::resize(&DPL,uVar9);
          fread((void *)CONCAT44(DPL.pdata._4_4_,DPL.pdata._0_4_),8,uVar9,__stream);
          if (uVar9 == 0) {
            lVar6 = 0;
          }
          else {
            sVar3 = 0;
            lVar6 = 0;
            do {
              lVar6 = lVar6 + *(long *)(CONCAT44(DPL.pdata._4_4_,DPL.pdata._0_4_) + sVar3 * 8) *
                              typeSize;
              sVar3 = sVar3 + 1;
            } while (uVar9 != sVar3);
          }
          fseek(__stream,lVar6,1);
          ns_MVECTOR::MVECTOR<unsigned_long>::~MVECTOR(&DPL);
          uVar5 = uVar5 + 1;
        } while (uVar5 < obj->LoadTotalTables);
        bVar1 = false;
      }
LAB_0011c427:
      if ((!bVar1) && (fseek(__stream,0xc,0), obj->LoadTableIndex != 0)) {
        uVar5 = 0;
        do {
          __off = ftell(__stream);
          fread(loadName,1,0x40,__stream);
          fread(loadType,1,0x40,__stream);
          fread(&typeSize,8,1,__stream);
          fread(&N,8,1,__stream);
          fread(&MaxRows,8,1,__stream);
          uVar9 = MaxRows;
          if (N < MaxRows) {
            uVar9 = N;
          }
          N = uVar9;
          iVar2 = strcmp(loadName,name);
          if (iVar2 == 0) {
            obj->LoadTableIndex = uVar5 + 1;
            bVar1 = true;
            break;
          }
          ns_MVECTOR::MVECTOR_Base::MVECTOR_Base(&DPL.super_MVECTOR_Base);
          DPL.elements._4_4_ = 0;
          DPL.mem_elements = 0;
          DPL.dbg = 0;
          DPL.pdata._0_4_ = 0;
          DPL.pdata._4_4_ = 0;
          DPL.elements._0_4_ = 0;
          DPL.step_elements = 0x400;
          DPL.step_elements_back = 0x2800;
          DPL.sptr.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)0x0;
          DPL.sptr.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          ns_MVECTOR::MVECTOR<unsigned_long>::resize(&DPL,uVar9);
          fread((void *)CONCAT44(DPL.pdata._4_4_,DPL.pdata._0_4_),8,uVar9,__stream);
          if (uVar9 == 0) {
            lVar6 = 0;
          }
          else {
            sVar3 = 0;
            lVar6 = 0;
            do {
              lVar6 = lVar6 + *(long *)(CONCAT44(DPL.pdata._4_4_,DPL.pdata._0_4_) + sVar3 * 8) *
                              typeSize;
              sVar3 = sVar3 + 1;
            } while (uVar9 != sVar3);
          }
          fseek(__stream,lVar6,1);
          ns_MVECTOR::MVECTOR<unsigned_long>::~MVECTOR(&DPL);
          uVar5 = uVar5 + 1;
        } while (uVar5 < obj->LoadTableIndex);
      }
      if (bVar1) {
        iVar2 = strcmp(loadType,type);
        if (iVar2 != 0) {
          fseek(__stream,__off,0);
          CECS::RecError((CECS *)CCEXPECS,-9999,1,"CCEXP.hpp",600,
                         "[%s]: LoadTable():: Table [%s] is of \"%s\" type, while requested LoadTable is of \"%s\" type!"
                         ,obj->SavingFile,name,loadType,type);
          return;
        }
        sVar3 = CCEXP::checkDuplicatedNames(obj,name);
        if (sVar3 == 0) {
          local_108.super___shared_ptr<CCEXP::CCEXPBase,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)operator_new(0xb8);
          (local_108.super___shared_ptr<CCEXP::CCEXPBase,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
          _vptr_CCEXPBase = (_func_int **)&PTR__CCEXPMat_0012f978;
          *(undefined2 *)
           ((long)&local_108.super___shared_ptr<CCEXP::CCEXPBase,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                   [0x11]._vptr_CCEXPBase + 2) = 0x100;
          local_108.super___shared_ptr<CCEXP::CCEXPBase,_(__gnu_cxx::_Lock_policy)2>._M_ptr[0x12].
          _vptr_CCEXPBase = (_func_int **)0x0;
          local_108.super___shared_ptr<CCEXP::CCEXPBase,_(__gnu_cxx::_Lock_policy)2>._M_ptr[0x13].
          _vptr_CCEXPBase = (_func_int **)0x0;
          local_108.super___shared_ptr<CCEXP::CCEXPBase,_(__gnu_cxx::_Lock_policy)2>._M_ptr[0x14].
          _vptr_CCEXPBase = (_func_int **)0x0;
          local_108.super___shared_ptr<CCEXP::CCEXPBase,_(__gnu_cxx::_Lock_policy)2>._M_ptr[0x15].
          _vptr_CCEXPBase = (_func_int **)0xffffffffffffffff;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<CCEXP::CCEXPBase*>
                    (&local_108.super___shared_ptr<CCEXP::CCEXPBase,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount,
                     local_108.super___shared_ptr<CCEXP::CCEXPBase,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr);
          ns_MVECTOR::MVECTOR<std::shared_ptr<CCEXP::CCEXPBase>_>::push_back(&obj->M,&local_108);
          if (local_108.super___shared_ptr<CCEXP::CCEXPBase,_(__gnu_cxx::_Lock_policy)2>._M_refcount
              ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_108.super___shared_ptr<CCEXP::CCEXPBase,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
          }
          this = (CCEXPMat<float> *)
                 (obj->M).pdata[(obj->M).elements - 1].
                 super___shared_ptr<CCEXP::CCEXPBase,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        }
        else {
          sVar3 = CCEXP::getTableIndexByName(obj,name);
          this = (CCEXPMat<float> *)
                 (obj->M).pdata[sVar3].
                 super___shared_ptr<CCEXP::CCEXPBase,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          (*(this->super_CCEXPBase)._vptr_CCEXPBase[0xf])(this);
        }
        iVar2 = CCEXPMat<float>::Initialize(this,loadName,loadType,MaxRows,obj);
        if (iVar2 == 0) {
          ns_MVECTOR::MVECTOR_Base::MVECTOR_Base(&DPL.super_MVECTOR_Base);
          uVar9 = N;
          DPL.elements._4_4_ = 0;
          DPL.mem_elements = 0;
          DPL.dbg = 0;
          DPL.pdata._0_4_ = 0;
          DPL.pdata._4_4_ = 0;
          DPL.elements._0_4_ = 0;
          DPL.step_elements = 0x400;
          DPL.step_elements_back = 0x2800;
          DPL.sptr.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)0x0;
          DPL.sptr.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          ns_MVECTOR::MVECTOR<unsigned_long>::resize(&DPL,N);
          fread((void *)CONCAT44(DPL.pdata._4_4_,DPL.pdata._0_4_),8,uVar9,__stream);
          ns_MVECTOR::MVECTOR_Base::MVECTOR_Base(&rowData.super_MVECTOR_Base);
          rowData.elements._4_4_ = 0;
          rowData.mem_elements = 0;
          rowData.dbg = 0;
          rowData.pdata._0_4_ = 0;
          rowData.pdata._4_4_ = 0;
          rowData.elements._0_4_ = 0;
          rowData.step_elements = 0x400;
          rowData.step_elements_back = 0x2800;
          rowData.sptr.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)0x0;
          rowData.sptr.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          if (uVar9 != 0) {
            uVar4 = 0;
            uVar5 = 0;
            do {
              new_elements_ = *(ulong *)(CONCAT44(DPL.pdata._4_4_,DPL.pdata._0_4_) + uVar4 * 8);
              if (uVar5 < new_elements_) {
                ns_MVECTOR::MVECTOR<float>::resize(&rowData,new_elements_);
                uVar5 = new_elements_;
              }
              fread((void *)CONCAT44(rowData.pdata._4_4_,rowData.pdata._0_4_),4,new_elements_,
                    __stream);
              iVar2 = CCEXPMat<float>::AddRow
                                (this,(float *)CONCAT44(rowData.pdata._4_4_,rowData.pdata._0_4_),
                                 new_elements_);
              if (iVar2 != 0) {
                CECS::RecError((CECS *)CCEXPECS,-9999,1,"CCEXP.hpp",0x273,
                               "[%s]: LoadTable():: Internal error occured while copying Table\'s [%s], row [%zu] from an opened file!"
                               ,obj->SavingFile,name,uVar4);
                goto LAB_0011c92c;
              }
              uVar4 = uVar4 + 1;
            } while (uVar9 != uVar4);
          }
          (*(this->super_CCEXPBase)._vptr_CCEXPBase[6])(this);
          if (obj->LoadTotalTables <= obj->LoadTableIndex) {
            obj->LoadTableIndex = 0;
            fseek(__stream,0xc,0);
          }
          obj->Status = 1;
LAB_0011c92c:
          ns_MVECTOR::MVECTOR<float>::~MVECTOR(&rowData);
          ns_MVECTOR::MVECTOR<unsigned_long>::~MVECTOR(&DPL);
          return;
        }
        pcVar8 = 
        "[%s]: LoadTable():: Internal error occured while copying Table [%s] from an opened file!";
        uVar7 = 0x268;
      }
      else {
        fseek(__stream,__off,0);
        pcVar8 = "[%s]: LoadTable():: Failed to find table [%s] into the last opened file!";
        uVar7 = 0x252;
      }
      CECS::RecError((CECS *)CCEXPECS,-9999,1,"CCEXP.hpp",uVar7,pcVar8,obj->SavingFile,name);
      return;
    }
    pcVar8 = "[%s]: LoadTable():: File pointer is NULL. Use CCEXP::Open() first!";
    uVar7 = 0x21c;
  }
  else {
    pcVar8 = "[%s]: LoadTable():: CCEXP object has wrong status!";
    uVar7 = 0x21a;
  }
  CECS::RecError((CECS *)CCEXPECS,-9999,1,"CCEXP.hpp",uVar7,pcVar8,obj->SavingFile);
  return;
}

Assistant:

inline void LoadTable(CCEXP &obj, const char* name, const char* type) {
	obj.ErrorId = 0;
	if (!obj.isActive) return;
	int prevStatus = obj.Status;
	// If any error occurs, then it should be critical error!
	obj.Status = CCEXPORTMAT_ACTIVE;
	CECS_ERR(CCEXPECS,(prevStatus != CCEXPORTMAT_INIT) && (prevStatus != CCEXPORTMAT_READY),"[%s]: LoadTable():: CCEXP object has wrong status!", obj.SavingFile);
	FILE* lfp = obj.lfp;
	CECS_ERR(CCEXPECS,lfp == NULL,"[%s]: LoadTable():: File pointer is NULL. Use CCEXP::Open() first!", obj.SavingFile);
	char loadName[64]={0};
	char loadType[64]={0};
	uint64_t typeSize=0;
	uint64_t N=0;
	uint64_t LastTablePosByte = 0;
	uint64_t MaxRows=0;
	bool TableFound = false;
	// Search from current LoadTableIndex to the Total Tables of files.
	for (uint64_t i = obj.LoadTableIndex; i < obj.LoadTotalTables; i++) {
		LastTablePosByte = ftell(lfp);
		fread(loadName,sizeof(char),64,lfp);
		fread(loadType,sizeof(char),64,lfp);
		fread(&typeSize,sizeof(uint64_t),1,lfp);
		fread(&N,sizeof(uint64_t),1,lfp);
		fread(&MaxRows,sizeof(uint64_t),1,lfp);
		if (N > MaxRows) N = MaxRows;
		if (strcmp(loadName,name)==0) {
			TableFound = true; obj.LoadTableIndex = i+1; break;
		}
		MVECTOR<uint64_t> DPL; DPL.resize(N);
		fread(DPL.data(), sizeof(uint64_t), N, lfp);
		uint64_t TableBytes = 0;
		for (uint64_t c = 0; c < N; c++)
			TableBytes += DPL[c]*typeSize;
		fseek(lfp, (long)TableBytes, SEEK_CUR);
	}
	if (!TableFound) {
		// If the Table has not been found in the file, search again from the start
		fseek(lfp, sizeof(uint32_t) + sizeof(uint64_t), SEEK_SET);

		for (uint64_t i = 0; i < obj.LoadTableIndex; i++) {
			LastTablePosByte = ftell(lfp);
			fread(loadName,sizeof(char),64,lfp);
			fread(loadType,sizeof(char),64,lfp);
			fread(&typeSize,sizeof(uint64_t),1,lfp);
			fread(&N,sizeof(uint64_t),1,lfp);
			fread(&MaxRows,sizeof(uint64_t),1,lfp);
			if (N > MaxRows) N = MaxRows;
			if (strcmp(loadName,name)==0) {
				TableFound = true; obj.LoadTableIndex = i+1; break;
			}
			MVECTOR<uint64_t> DPL; DPL.resize(N);
			fread(DPL.data(), sizeof(uint64_t), N, lfp);
			uint64_t TableBytes = 0;
			for (uint64_t c = 0; c < N; c++)
				TableBytes += DPL[c]*typeSize;
			fseek(lfp, (long)TableBytes, SEEK_CUR);
		}
	}

	// If the Table hot not been found, then abort with error.
	if(!TableFound) {
		fseek(lfp, (long)LastTablePosByte, SEEK_SET);
		CECS_ERR(CCEXPECS,1, "[%s]: LoadTable():: Failed to find table [%s] into the last opened file!", obj.SavingFile, name);
	}

	// At this point the table has been found, and we have to reload it!
	if (strcmp(loadType, type) != 0) {
		fseek(lfp, (long)LastTablePosByte, SEEK_SET);
		CECS_ERR(CCEXPECS,1,"[%s]: LoadTable():: Table [%s] is of \"%s\" type, while requested LoadTable is of \"%s\" type!", obj.SavingFile, name, loadType, type);
	}

	CCEXPMat<T> *U;
	if (obj.checkDuplicatedNames(name) > 0) { // If the table already exist!
		size_t idx = obj.getTableIndexByName(name);
		U = static_cast<CCEXPMat<T>*>(obj.M[idx].get());
		U->Reset();
	}
	else
	{// If the table does not exist create a new Table...
		obj.M.push_back(shared_ptr<CCEXPBase>((CCEXPBase*) new CCEXPMat<T>));
		U = static_cast<CCEXPMat<T>*>(obj.M[obj.M.size()-1].get());
	}

	int ret = U->Initialize(loadName, loadType, MaxRows, &obj);
	CECS_ERR(CCEXPECS,ret != 0,"[%s]: LoadTable():: Internal error occured while copying Table [%s] from an opened file!", obj.SavingFile, name);
	// Copy data from file to the new table.
	MVECTOR<uint64_t> DPL; DPL.resize(N);
	fread(DPL.data(), sizeof(uint64_t), N, lfp);
	MVECTOR<T> rowData;
	uint64_t maxCols=0;
	for (uint64_t row = 0; row < N; row++) {
		const uint64_t columns = DPL[row];
		if (columns > maxCols) { maxCols = columns; rowData.resize(maxCols); }
		fread(rowData.data(), sizeof(T), columns, lfp);
		ret = U->AddRow(rowData.data(), columns);
		CECS_ERR(CCEXPECS,ret != 0,"[%s]: LoadTable():: Internal error occured while copying Table's [%s], row [" __ZU__ "] from an opened file!", obj.SavingFile, name, (size_t)row);
	}
	// Warning: newRowFlag should be set to false, thus use to be able
	// add data directly to the end of the last row if he want.
	U->NoNewRow();

	if (obj.LoadTableIndex >= obj.LoadTotalTables) {
		obj.LoadTableIndex = 0;
		fseek(lfp, sizeof(uint32_t) + sizeof(uint64_t), SEEK_SET);
	}

	obj.Status = CCEXPORTMAT_READY;
}